

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void test<double>(char *name)

{
  int iVar1;
  size_t i;
  long lVar2;
  long lVar3;
  undefined1 *puVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  undefined1 auVar8 [16];
  double local_60;
  double local_48;
  double dStack_40;
  
  if (test<double>(char_const*)::dft == '\0') {
    iVar1 = __cxa_guard_acquire(&test<double>(char_const*)::dft);
    if (iVar1 != 0) {
      SlidingDFT<double,_64UL>::SlidingDFT(&test<double>::dft);
      __cxa_guard_release(&test<double>(char_const*)::dft);
    }
  }
  puVar4 = &DAT_000fb6f0;
  lVar3 = 0x102af0;
  local_60 = 0.0;
  lVar6 = 0;
  for (lVar2 = 0; lVar2 != 0x79; lVar2 = lVar2 + 1) {
    SlidingDFT<double,_64UL>::update(&test<double>::dft,(double)test1_time_domain_data[lVar2]);
    if (test<double>::dft.data_valid == true) {
      for (lVar5 = 0; lVar5 != 0x200; lVar5 = lVar5 + 8) {
        local_48 = *(double *)(test<double>::dft.dft[0]._M_value + lVar5 * 2) -
                   *(double *)(puVar4 + lVar5);
        dStack_40 = *(double *)(test<double>::dft.dft[0]._M_value + lVar5 * 2 + 8) -
                    *(double *)(lVar3 + lVar5);
        dVar7 = std::abs<double>((complex<double> *)&local_48);
        local_60 = local_60 + dVar7;
      }
      lVar6 = lVar6 + 0x40;
    }
    puVar4 = puVar4 + 0x200;
    lVar3 = lVar3 + 0x200;
  }
  auVar8._8_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar8._0_8_ = lVar6;
  auVar8._12_4_ = 0x45300000;
  printf("%s: compared %zu complex numbers with an average error of %e\n",
         local_60 /
         ((auVar8._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)),name,lVar6);
  return;
}

Assistant:

void test(const char *name)
{
	static SlidingDFT<T, test1_FFT_LENGTH> dft;
	double error_sum = 0;
	size_t num_comparisons = 0;

	for (size_t i = 0; i < test1_TIME_LENGTH; i++) {
		dft.update((T)test1_time_domain[i]);
		if (dft.is_data_valid()) {
			for (size_t j = 0; j < test1_FFT_LENGTH; j++) {
				complex<double> calculated = dft.dft[j];
				complex<double> exact(test1_dft_real[i - test1_FFT_LENGTH + 1][j], test1_dft_imag[i - test1_FFT_LENGTH + 1][j]);
				double error = abs(calculated - exact);
				/*printf("[%2i,%2i] Calculated (%10.3e,%10.3e); expected (%10.3e,%10.3e), error=%11.6e\n", i, j,
					   calculated.real(), calculated.imag(),
					   exact.real(), exact.imag(),
					   error);*/
				error_sum += error;
				num_comparisons++;
			}
		}
	}
	double mean_error = error_sum / num_comparisons;
	printf("%s: compared %zu complex numbers with an average error of %e\n", name, num_comparisons, mean_error);
}